

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<int&,std::integral_constant<unsigned_long,1ul>>>,true>::type_const,ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<int&>,ranges::variant<int&,int&>>,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
              (long n,undefined8 *self,undefined8 param_3,undefined8 param_4)

{
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  if (n == 0) {
    local_8 = *self;
    local_18 = param_3;
    local_10 = param_4;
    composed<ranges::detail::emplace_fn<ranges::variant<void,void>,1ul>,ranges::detail::unique_visitor<ranges::variant<int&>,ranges::variant<int&,int&>>>
    ::
    do_<ranges::detail::unique_visitor<ranges::variant<int&>,ranges::variant<int&,int&>>,ranges::detail::emplace_fn<ranges::variant<void,void>,1ul>,ranges::indexed_element<int&,1ul>&>
              (&local_18,&local_10,&local_8);
    return 0;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/detail/variant.hpp"
                ,0x15a,
                "int ranges::detail::variant_visit_(std::size_t, variant_nil, Fun, Proj) [Fun = ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<int &>, ranges::variant<int &, int &>>, ranges::variant<void, void>>, Proj = ranges::detail::indexed_element_fn]"
               );
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }